

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReshapeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  bool bVar1;
  undefined1 *puVar2;
  Result *_result;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    this_00 = &__return_storage_ptr__->m_message;
    std::__cxx11::string::~string((string *)this_00);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::~string((string *)this_00);
      if (this->ndArrayInterpretation == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"Reshape",(allocator<char> *)&err);
        validateInputOutputRankEquality
                  (__return_storage_ptr__,layer,&local_40,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_40);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err,"Reshape",(allocator<char> *)&local_60);
        validateRankCount(__return_storage_ptr__,layer,&err,5,5,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&err);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
      }
      if (layer->_oneof_case_[0] == 300) {
        puVar2 = *(undefined1 **)&layer->layer_;
      }
      else {
        puVar2 = Specification::_ReshapeLayerParams_default_instance_;
      }
      if ((((ConvolutionLayerParams *)puVar2)->kernelsize_).current_size_ - 3U < 2) {
        Result::Result(__return_storage_ptr__);
      }
      else {
        std::operator+(&local_60,"Reshape layer \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+(&err,&local_60,"\' target shape must be 3D or 4D.");
        std::__cxx11::string::~string((string *)&local_60);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
        std::__cxx11::string::~string((string *)&err);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReshapeLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Reshape", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Reshape", 5, 5, blobNameToRank));
    }

    const auto& params = layer.reshape();
    if (params.targetshape_size() != 3 && params.targetshape_size() != 4) {
        std::string err = "Reshape layer '" + layer.name() + "' target shape must be 3D or 4D.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}